

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::VerifyInputFilesInDescriptors
          (CommandLineInterface *this,DescriptorDatabase *database)

{
  pointer pbVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  pointer pbVar5;
  FileDescriptorProto file_descriptor;
  
  pbVar5 = (this->input_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->input_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar5 == pbVar1) {
LAB_00199968:
      return pbVar5 == pbVar1;
    }
    FileDescriptorProto::FileDescriptorProto(&file_descriptor);
    iVar2 = (*database->_vptr_DescriptorDatabase[2])(database,pbVar5,&file_descriptor);
    if ((char)iVar2 == '\0') {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Could not find file in descriptor database: ")
      ;
      poVar4 = std::operator<<(poVar4,(string *)pbVar5);
      poVar4 = std::operator<<(poVar4,": ");
      pcVar3 = strerror(2);
      poVar4 = std::operator<<(poVar4,pcVar3);
LAB_00199956:
      std::endl<char,std::char_traits<char>>(poVar4);
      FileDescriptorProto::~FileDescriptorProto(&file_descriptor);
      goto LAB_00199968;
    }
    if ((this->disallow_services_ == true) &&
       (0 < file_descriptor.field_0._impl_.service_.super_RepeatedPtrFieldBase.current_size_)) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               (string *)
                               ((ulong)file_descriptor.field_0._impl_.name_.tagged_ptr_.ptr_ &
                               0xfffffffffffffffc));
      poVar4 = std::operator<<(poVar4,
                               ": This file contains services, but --disallow_services was used.");
      goto LAB_00199956;
    }
    FileDescriptorProto::~FileDescriptorProto(&file_descriptor);
    pbVar5 = pbVar5 + 1;
  } while( true );
}

Assistant:

bool CommandLineInterface::VerifyInputFilesInDescriptors(
    DescriptorDatabase* database) {
  for (const auto& input_file : input_files_) {
    FileDescriptorProto file_descriptor;
    if (!database->FindFileByName(input_file, &file_descriptor)) {
      std::cerr << "Could not find file in descriptor database: " << input_file
                << ": " << strerror(ENOENT) << std::endl;
      return false;
    }

    // Enforce --disallow_services.
    if (disallow_services_ && file_descriptor.service_size() > 0) {
      std::cerr << file_descriptor.name()
                << ": This file contains services, but "
                   "--disallow_services was used."
                << std::endl;
      return false;
    }
  }
  return true;
}